

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O0

int __thiscall mpt::client::convert(client *this,type_t type,void *ptr)

{
  bool bVar1;
  config *pcVar2;
  metatype *local_48;
  int local_3c;
  client *pcStack_38;
  int cfg;
  int local_2c;
  undefined8 *puStack_28;
  int me;
  void *ptr_local;
  type_t type_local;
  client *this_local;
  
  puStack_28 = (undefined8 *)ptr;
  ptr_local = (void *)type;
  type_local = (type_t)this;
  local_2c = type_properties<mpt::client_*>::id(true);
  if (local_2c < 0) {
    local_2c = 0x100;
  }
  else {
    pcStack_38 = this;
    bVar1 = assign<mpt::client*>(&stack0xffffffffffffffc8,(int)ptr_local,puStack_28);
    if (bVar1) {
      return 0x85;
    }
  }
  if (ptr_local == (void *)0x0) {
    if (puStack_28 != (undefined8 *)0x0) {
      *puStack_28 = convert::fmt;
    }
    this_local._4_4_ = local_2c;
  }
  else {
    local_3c = type_properties<mpt::config_*>::id(true);
    if ((local_3c < 1) || (ptr_local != (void *)(long)local_3c)) {
      local_48 = &this->super_metatype;
      bVar1 = assign<mpt::metatype*>(&local_48,(int)ptr_local,puStack_28);
      if (bVar1) {
        this_local._4_4_ = 0x85;
      }
      else {
        this_local._4_4_ = -3;
      }
    }
    else {
      if (puStack_28 != (undefined8 *)0x0) {
        pcVar2 = clientConfig();
        *puStack_28 = pcVar2;
      }
      this_local._4_4_ = local_2c;
    }
  }
  return this_local._4_4_;
}

Assistant:

int client::convert(type_t type, void *ptr)
{
	int me = type_properties<client *>::id(true);
	if (me < 0) {
		me = TypeMetaPtr;
	}
	else if (assign(this, type, ptr)) {
		return TypeConfigPtr;
	}
	if (!type) {
		static const uint8_t fmt[] = { TypeConfigPtr, 0 };
		if (ptr) *static_cast<const uint8_t **>(ptr) = fmt;
		return me;
	}
	int cfg = type_properties<class config *>::id(true);
	if ((cfg > 0) && (type == static_cast<type_t>(cfg))) {
		if (ptr) *static_cast<class config **>(ptr) = clientConfig();
		return me;
	}
	if (assign(static_cast<metatype *>(this), type, ptr)) {
		return TypeConfigPtr;
	}
	return BadType;
}